

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void do_xsave(CPUX86State *env,target_ulong ptr,uint64_t rfbm,uint64_t inuse,uint64_t opt,
             uintptr_t ra)

{
  uint64_t uVar1;
  ulong uVar2;
  int exception_index;
  ulong uVar3;
  long lVar4;
  
  if ((*(byte *)((long)env->cr + 0x22) & 4) == 0) {
    exception_index = 6;
  }
  else {
    if ((ptr & 0x3f) == 0) {
      uVar3 = rfbm & env->xcr0;
      uVar2 = opt & uVar3;
      if ((uVar2 & 1) != 0) {
        do_xsave_fpu(env,ptr,ra);
      }
      if ((uVar3 & 2) != 0) {
        cpu_stl_data_ra_x86_64(env,ptr | 0x18,env->mxcsr,ra);
        cpu_stl_data_ra_x86_64(env,ptr | 0x1c,0xffff,ra);
      }
      if ((uVar2 & 2) != 0) {
        do_xsave_sse(env,ptr,ra);
      }
      if ((uVar2 & 8) != 0) {
        lVar4 = 0;
        do {
          cpu_stq_data_ra_x86_64
                    (env,lVar4 + ptr + 0x3c0,*(uint64_t *)((long)&env->bnd_regs[0].lb + lVar4),ra);
          cpu_stq_data_ra_x86_64
                    (env,lVar4 + ptr + 0x3c0 + 8,*(uint64_t *)((long)&env->bnd_regs[0].ub + lVar4),
                     ra);
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x40);
      }
      if ((uVar2 & 0x10) != 0) {
        cpu_stq_data_ra_x86_64(env,ptr + 0x400,(env->bndcs_regs).cfgu,ra);
        cpu_stq_data_ra_x86_64(env,ptr + 0x408,(env->bndcs_regs).sts,ra);
      }
      if (((uint)uVar2 >> 9 & 1) != 0) {
        cpu_stq_data_ra_x86_64(env,ptr + 0xa80,(ulong)env->pkru,ra);
      }
      uVar1 = cpu_ldq_data_ra_x86_64(env,ptr + 0x200,ra);
      cpu_stq_data_ra_x86_64(env,ptr + 0x200,(inuse ^ uVar1) & uVar3 ^ uVar1,ra);
      return;
    }
    exception_index = 0xd;
  }
  raise_exception_ra_x86_64(env,exception_index,ra);
}

Assistant:

static void do_xsave(CPUX86State *env, target_ulong ptr, uint64_t rfbm,
                     uint64_t inuse, uint64_t opt, uintptr_t ra)
{
    uint64_t old_bv, new_bv;

    /* The OS must have enabled XSAVE.  */
    if (!(env->cr[4] & CR4_OSXSAVE_MASK)) {
        raise_exception_ra(env, EXCP06_ILLOP, ra);
    }

    /* The operand must be 64 byte aligned.  */
    if (ptr & 63) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    /* Never save anything not enabled by XCR0.  */
    rfbm &= env->xcr0;
    opt &= rfbm;

    if (opt & XSTATE_FP_MASK) {
        do_xsave_fpu(env, ptr, ra);
    }
    if (rfbm & XSTATE_SSE_MASK) {
        /* Note that saving MXCSR is not suppressed by XSAVEOPT.  */
        do_xsave_mxcsr(env, ptr, ra);
    }
    if (opt & XSTATE_SSE_MASK) {
        do_xsave_sse(env, ptr, ra);
    }
    if (opt & XSTATE_BNDREGS_MASK) {
        do_xsave_bndregs(env, ptr + XO(bndreg_state), ra);
    }
    if (opt & XSTATE_BNDCSR_MASK) {
        do_xsave_bndcsr(env, ptr + XO(bndcsr_state), ra);
    }
    if (opt & XSTATE_PKRU_MASK) {
        do_xsave_pkru(env, ptr + XO(pkru_state), ra);
    }

    /* Update the XSTATE_BV field.  */
    old_bv = cpu_ldq_data_ra(env, ptr + XO(header.xstate_bv), ra);
    new_bv = (old_bv & ~rfbm) | (inuse & rfbm);
    cpu_stq_data_ra(env, ptr + XO(header.xstate_bv), new_bv, ra);
}